

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

insert_return_type * __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
::insert(insert_return_type *__return_storage_ptr__,
        raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
        *this,node_type *node)

{
  bool bVar1;
  slot_type *slot;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ts;
  iterator iVar2;
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  *local_50;
  slot_type *local_48;
  undefined1 local_40 [8];
  pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_bool>
  res;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *elem;
  node_type *node_local;
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  *this_local;
  
  bVar1 = node_handle_base::operator_cast_to_bool((node_handle_base *)node);
  if (bVar1) {
    slot = CommonAccess::
           GetSlot<phmap::priv::node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,void>,std::allocator<int>,void>>
                     (node);
    ts = hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>::
         element<phmap::priv::(anonymous_namespace)::StringPolicy>(slot);
    local_50 = this;
    res._16_8_ = ts;
    local_48 = CommonAccess::
               GetSlot<phmap::priv::node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,void>,std::allocator<int>,void>>
                         (node);
    hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,void>::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>::InsertSlot<false>,std::pair<std::__cxx11::string,std::__cxx11::string>const&,phmap::priv::(anonymous_namespace)::StringPolicy>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_bool>
                *)local_40,
               (hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,void> *)
               &local_50,(InsertSlot<false> *)res._16_8_,ts);
    if ((res.first.field_1._0_1_ & 1) == 0) {
      (__return_storage_ptr__->position).ctrl_ = (ctrl_t *)local_40;
      (__return_storage_ptr__->position).field_1.slot_ = (slot_type *)res.first.ctrl_;
      __return_storage_ptr__->inserted = false;
      node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>
      ::node_handle(&__return_storage_ptr__->node,node);
    }
    else {
      CommonAccess::
      Reset<phmap::priv::node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,void>,std::allocator<int>,void>>
                (node);
      (__return_storage_ptr__->position).ctrl_ = (ctrl_t *)local_40;
      (__return_storage_ptr__->position).field_1.slot_ = (slot_type *)res.first.ctrl_;
      __return_storage_ptr__->inserted = true;
      node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>
      ::node_handle(&__return_storage_ptr__->node);
    }
  }
  else {
    iVar2 = end(this);
    __return_storage_ptr__->position = iVar2;
    __return_storage_ptr__->inserted = false;
    node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>
    ::node_handle(&__return_storage_ptr__->node);
  }
  return __return_storage_ptr__;
}

Assistant:

insert_return_type insert(node_type&& node) {
        if (!node) return {end(), false, node_type()};
        const auto& elem = PolicyTraits::element(CommonAccess::GetSlot(node));
        auto res = PolicyTraits::apply(
            InsertSlot<false>{*this, std::move(*CommonAccess::GetSlot(node))},
            elem);
        if (res.second) {
            CommonAccess::Reset(&node);
            return {res.first, true, node_type()};
        } else {
            return {res.first, false, std::move(node)};
        }
    }